

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,char_type *value)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  char cVar1;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_ffffffffffffffd8;
  cstring_spec_handler *in_stack_ffffffffffffffe0;
  basic_buffer<char> *local_8;
  
  if (in_RDI->specs_ == (format_specs *)0x0) {
    write(in_RDI,in_ESI,in_RDX,in_RCX);
    local_8 = (basic_buffer<char> *)
              out((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  else {
    cVar1 = (in_RDI->specs_->super_core_format_specs).type;
    cstring_spec_handler::cstring_spec_handler
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char_type *)in_RDI);
    handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::cstring_spec_handler>
              ((char)((ulong)in_RDI >> 0x38),
               (cstring_spec_handler *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
    local_8 = (basic_buffer<char> *)
              out((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                   *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
  }
  return (iterator)local_8;
}

Assistant:

iterator operator()(const char_type *value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(
          specs_->type, cstring_spec_handler(*this, value));
    return out();
  }